

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O3

void __thiscall
QComboBox::insertItem(QComboBox *this,int index,QIcon *icon,QString *text,QVariant *userData)

{
  QPersistentModelIndex *this_00;
  QComboBoxPrivate *this_01;
  QAbstractItemModel *pQVar1;
  char cVar2;
  uint uVar3;
  long lVar4;
  QStandardItem *this_02;
  int iVar5;
  QComboBoxPrivate *d;
  uint start;
  long in_FS_OFFSET;
  int local_84;
  QMap<int,_QVariant> local_80;
  QStandardItem *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QComboBoxPrivate **)&(this->super_QWidget).field_0x8;
  pQVar1 = this_01->model;
  this_00 = &this_01->root;
  QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_58,this_00);
  uVar3 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,&local_58);
  if ((int)uVar3 < index) {
    index = uVar3;
  }
  start = 0;
  if (0 < index) {
    start = index;
  }
  if (this_01->maxCount <= (int)start) goto LAB_003d9ea2;
  lVar4 = QMetaObject::cast((QObject *)&QStandardItemModel::staticMetaObject);
  if (lVar4 == 0) {
    this_01->field_0x34c = this_01->field_0x34c | 8;
    pQVar1 = this_01->model;
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_58,this_00);
    cVar2 = (**(code **)(*(long *)pQVar1 + 0xf8))(pQVar1,start,1,&local_58);
    if (cVar2 != '\0') {
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      local_78 = (QStandardItem *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
      pQVar1 = this_01->model;
      iVar5 = this_01->modelColumn;
      QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_58,this_00);
      (**(code **)(*(long *)pQVar1 + 0x60))(&local_78,pQVar1,start,iVar5,&local_58);
      cVar2 = QIcon::isNull();
      if ((cVar2 == '\0') || (3 < *(ulong *)&(userData->d).field_0x18)) {
        local_80.d.d.ptr =
             (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
              )(totally_ordered_wrapper<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_*>
                )0x0;
        if ((text->d).ptr != (char16_t *)0x0) {
          local_84 = 2;
          ::QVariant::QVariant((QVariant *)&local_58,(QString *)text);
          QMap<int,_QVariant>::insert(&local_80,&local_84,(QVariant *)&local_58);
          ::QVariant::~QVariant((QVariant *)&local_58);
        }
        cVar2 = QIcon::isNull();
        if (cVar2 == '\0') {
          local_84 = 1;
          QIcon::operator_cast_to_QVariant((QVariant *)&local_58,icon);
          QMap<int,_QVariant>::insert(&local_80,&local_84,(QVariant *)&local_58);
          ::QVariant::~QVariant((QVariant *)&local_58);
        }
        if (3 < *(ulong *)&(userData->d).field_0x18) {
          local_58._0_4_ = 0x100;
          QMap<int,_QVariant>::insert(&local_80,(int *)local_58.data,userData);
        }
        if ((local_80.d.d.ptr !=
             (totally_ordered_wrapper<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_*>
              )0x0) && (*(size_t *)((long)local_80.d.d.ptr + 0x30) != 0)) {
          (**(code **)(*(long *)this_01->model + 0xb8))(this_01->model,&local_78,&local_80);
        }
        QtPrivate::
        QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
        ::~QExplicitlySharedDataPointerV2(&local_80.d);
      }
      else {
        pQVar1 = this_01->model;
        ::QVariant::QVariant((QVariant *)&local_58,(QString *)text);
        (**(code **)(*(long *)pQVar1 + 0x98))(pQVar1,&local_78,&local_58,2);
        ::QVariant::~QVariant((QVariant *)&local_58);
      }
      this_01->field_0x34c = this_01->field_0x34c & 0xf7;
      QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_58,this_00);
      QComboBoxPrivate::rowsInserted(this_01,(QModelIndex *)&local_58,start,start);
      goto LAB_003d9e67;
    }
    this_01->field_0x34c = this_01->field_0x34c & 0xf7;
  }
  else {
    this_02 = (QStandardItem *)operator_new(0x10);
    QStandardItem::QStandardItem(this_02,(QString *)text);
    cVar2 = QIcon::isNull();
    if (cVar2 == '\0') {
      QIcon::operator_cast_to_QVariant((QVariant *)&local_58,icon);
      (**(code **)(*(long *)this_02 + 0x20))(this_02,&local_58,1);
      ::QVariant::~QVariant((QVariant *)&local_58);
    }
    if (3 < *(ulong *)&(userData->d).field_0x18) {
      (**(code **)(*(long *)this_02 + 0x20))(this_02,userData,0x100);
    }
    local_58.shared = (PrivateShared *)0x0;
    local_58._8_8_ = 0;
    local_58._16_8_ = 0;
    local_78 = this_02;
    QtPrivate::QPodArrayOps<QStandardItem*>::emplace<QStandardItem*&>
              ((QPodArrayOps<QStandardItem*> *)local_58.data,0,&local_78);
    QList<QStandardItem_*>::end((QList<QStandardItem_*> *)&local_58);
    QStandardItemModel::insertRow((int)lVar4,(QList_conflict *)(ulong)start);
    if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_58.shared = *(int *)local_58.shared + -1;
      UNLOCK();
      if (*(int *)local_58.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_58.shared,8,0x10);
      }
    }
LAB_003d9e67:
    uVar3 = uVar3 + 1;
  }
  iVar5 = uVar3 - this_01->maxCount;
  if (iVar5 != 0 && this_01->maxCount <= (int)uVar3) {
    pQVar1 = this_01->model;
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_58,this_00);
    (**(code **)(*(long *)pQVar1 + 0x108))(pQVar1,uVar3 - 1,iVar5,&local_58);
  }
LAB_003d9ea2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBox::insertItem(int index, const QIcon &icon, const QString &text, const QVariant &userData)
{
    Q_D(QComboBox);
    int itemCount = count();
    index = qBound(0, index, itemCount);
    if (index >= d->maxCount)
        return;

    // For the common case where we are using the built in QStandardItemModel
    // construct a QStandardItem, reducing the number of expensive signals from the model
    if (QStandardItemModel *m = qobject_cast<QStandardItemModel*>(d->model)) {
        QStandardItem *item = new QStandardItem(text);
        if (!icon.isNull()) item->setData(icon, Qt::DecorationRole);
        if (userData.isValid()) item->setData(userData, Qt::UserRole);
        m->insertRow(index, item);
        ++itemCount;
    } else {
        d->inserting = true;
        if (d->model->insertRows(index, 1, d->root)) {
            QModelIndex item = d->model->index(index, d->modelColumn, d->root);
            if (icon.isNull() && !userData.isValid()) {
                d->model->setData(item, text, Qt::EditRole);
            } else {
                QMap<int, QVariant> values;
                if (!text.isNull()) values.insert(Qt::EditRole, text);
                if (!icon.isNull()) values.insert(Qt::DecorationRole, icon);
                if (userData.isValid()) values.insert(Qt::UserRole, userData);
                if (!values.isEmpty()) d->model->setItemData(item, values);
            }
            d->inserting = false;
            d->rowsInserted(d->root, index, index);
            ++itemCount;
        } else {
            d->inserting = false;
        }
    }

    if (itemCount > d->maxCount)
        d->model->removeRows(itemCount - 1, itemCount - d->maxCount, d->root);
}